

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDocumentationFormatter.cxx
# Opt level: O2

void __thiscall
cmDocumentationFormatter::PrintFormatted(cmDocumentationFormatter *this,ostream *os,char *text)

{
  char cVar1;
  char *pcVar2;
  string paragraph;
  string preformatted;
  
  if (text != (char *)0x0) {
    while (*text != '\0') {
      preformatted._M_dataplus._M_p = (pointer)&preformatted.field_2;
      preformatted._M_string_length = 0;
      preformatted.field_2._M_local_buf[0] = '\0';
LAB_00310544:
      if (*text == ' ') {
        cVar1 = ' ';
        while (pcVar2 = text + 1, cVar1 != '\0') {
          text = pcVar2;
          if (cVar1 == '\n') {
            std::__cxx11::string::append((ulong)&preformatted,'\x01');
            break;
          }
          std::__cxx11::string::append((ulong)&preformatted,'\x01');
          cVar1 = *pcVar2;
        }
        goto LAB_00310544;
      }
      if (preformatted._M_string_length != 0) {
        (*this->_vptr_cmDocumentationFormatter[3])(this,os,preformatted._M_dataplus._M_p);
      }
      paragraph._M_dataplus._M_p = (pointer)&paragraph.field_2;
      paragraph._M_string_length = 0;
      paragraph.field_2._M_local_buf[0] = '\0';
      for (; *text != '\0'; text = text + 1) {
        if (*text == '\n') {
          std::__cxx11::string::append((ulong)&paragraph,'\x01');
          text = text + 1;
          break;
        }
        std::__cxx11::string::append((ulong)&paragraph,'\x01');
      }
      if (paragraph._M_string_length != 0) {
        (*this->_vptr_cmDocumentationFormatter[4])(this,os,paragraph._M_dataplus._M_p);
      }
      std::__cxx11::string::~string((string *)&paragraph);
      std::__cxx11::string::~string((string *)&preformatted);
    }
  }
  return;
}

Assistant:

void cmDocumentationFormatter::PrintFormatted(std::ostream& os,
                                              const char* text)
{
  if(!text)
    {
    return;
    }
  const char* ptr = text;
  while(*ptr)
    {
    // Any ptrs starting in a space are treated as preformatted text.
    std::string preformatted;
    while(*ptr == ' ')
      {
      for(char ch = *ptr; ch && ch != '\n'; ++ptr, ch = *ptr)
        {
        preformatted.append(1, ch);
        }
      if(*ptr)
        {
        ++ptr;
        preformatted.append(1, '\n');
        }
      }
    if(!preformatted.empty())
      {
      this->PrintPreformatted(os, preformatted.c_str());
      }

    // Other ptrs are treated as paragraphs.
    std::string paragraph;
    for(char ch = *ptr; ch && ch != '\n'; ++ptr, ch = *ptr)
      {
      paragraph.append(1, ch);
      }
    if(*ptr)
      {
      ++ptr;
      paragraph.append(1, '\n');
      }
    if(!paragraph.empty())
      {
      this->PrintParagraph(os, paragraph.c_str());
      }
    }
}